

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_program __thiscall
CLIntercept::createProgramWithInjectionSPIRV
          (CLIntercept *this,uint64_t hash,cl_context context,cl_int *errcode_ret)

{
  double dVar1;
  char *pcVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  cl_icd_dispatch *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  cl_int *in_RCX;
  cl_context in_RDX;
  ulong in_RSI;
  CLIntercept *in_RDI;
  float __x;
  char *newILBinary;
  size_t filesize;
  ifstream is;
  string fileName2;
  string fileName1;
  char numberString2 [256];
  char numberString1 [256];
  string fileName;
  cl_program program;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffff908;
  lock_guard<std::mutex> *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 uVar6;
  string *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  Services_Common *in_stack_fffffffffffff970;
  string *this_00;
  int local_624;
  void *local_620;
  undefined1 local_618 [16];
  ulong local_608;
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  long local_500 [65];
  string local_2f8 [32];
  string local_2d8 [32];
  char local_2b8 [527];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [39];
  allocator local_61;
  string local_60 [48];
  cl_program local_30;
  cl_int *local_20;
  cl_context local_18;
  ulong local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_30 = (cl_program)0x0;
  pcVar5 = dispatch(in_RDI);
  if (pcVar5->clCreateProgramWithIL == (cl_api_clCreateProgramWithIL)0x0) {
    std::allocator<char>::allocator();
    dVar1 = (double)std::__cxx11::string::string
                              (local_60,
                               "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n"
                               ,&local_61);
    log(in_RDI,dVar1);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    std::__cxx11::string::string(local_88);
    OS(in_RDI);
    pcVar2 = sc_DumpDirectoryName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar2,&local_a9);
    ::OS::Services_Common::GetDumpDirectoryNameWithoutPid
              (in_stack_fffffffffffff970,
               (string *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::operator+=(local_88,"/Inject");
    local_2b8[0x1f0] = '\0';
    local_2b8[0x1f1] = '\0';
    local_2b8[0x1f2] = '\0';
    local_2b8[499] = '\0';
    local_2b8[500] = '\0';
    local_2b8[0x1f5] = '\0';
    local_2b8[0x1f6] = '\0';
    local_2b8[0x1f7] = '\0';
    local_2b8[0x1f8] = '\0';
    local_2b8[0x1f9] = '\0';
    local_2b8[0x1fa] = '\0';
    local_2b8[0x1fb] = '\0';
    local_2b8[0x1fc] = '\0';
    local_2b8[0x1fd] = '\0';
    local_2b8[0x1fe] = '\0';
    local_2b8[0x1ff] = '\0';
    local_2b8[0x1e0] = '\0';
    local_2b8[0x1e1] = '\0';
    local_2b8[0x1e2] = '\0';
    local_2b8[0x1e3] = '\0';
    local_2b8[0x1e4] = '\0';
    local_2b8[0x1e5] = '\0';
    local_2b8[0x1e6] = '\0';
    local_2b8[0x1e7] = '\0';
    local_2b8[0x1e8] = '\0';
    local_2b8[0x1e9] = '\0';
    local_2b8[0x1ea] = '\0';
    local_2b8[0x1eb] = '\0';
    local_2b8[0x1ec] = '\0';
    local_2b8[0x1ed] = '\0';
    local_2b8[0x1ee] = '\0';
    local_2b8[0x1ef] = '\0';
    local_2b8[0x1d0] = '\0';
    local_2b8[0x1d1] = '\0';
    local_2b8[0x1d2] = '\0';
    local_2b8[0x1d3] = '\0';
    local_2b8[0x1d4] = '\0';
    local_2b8[0x1d5] = '\0';
    local_2b8[0x1d6] = '\0';
    local_2b8[0x1d7] = '\0';
    local_2b8[0x1d8] = '\0';
    local_2b8[0x1d9] = '\0';
    local_2b8[0x1da] = '\0';
    local_2b8[0x1db] = '\0';
    local_2b8[0x1dc] = '\0';
    local_2b8[0x1dd] = '\0';
    local_2b8[0x1de] = '\0';
    local_2b8[0x1df] = '\0';
    local_2b8[0x1c0] = '\0';
    local_2b8[0x1c1] = '\0';
    local_2b8[0x1c2] = '\0';
    local_2b8[0x1c3] = '\0';
    local_2b8[0x1c4] = '\0';
    local_2b8[0x1c5] = '\0';
    local_2b8[0x1c6] = '\0';
    local_2b8[0x1c7] = '\0';
    local_2b8[0x1c8] = '\0';
    local_2b8[0x1c9] = '\0';
    local_2b8[0x1ca] = '\0';
    local_2b8[0x1cb] = '\0';
    local_2b8[0x1cc] = '\0';
    local_2b8[0x1cd] = '\0';
    local_2b8[0x1ce] = '\0';
    local_2b8[0x1cf] = '\0';
    local_2b8[0x1b0] = '\0';
    local_2b8[0x1b1] = '\0';
    local_2b8[0x1b2] = '\0';
    local_2b8[0x1b3] = '\0';
    local_2b8[0x1b4] = '\0';
    local_2b8[0x1b5] = '\0';
    local_2b8[0x1b6] = '\0';
    local_2b8[0x1b7] = '\0';
    local_2b8[0x1b8] = '\0';
    local_2b8[0x1b9] = '\0';
    local_2b8[0x1ba] = '\0';
    local_2b8[0x1bb] = '\0';
    local_2b8[0x1bc] = '\0';
    local_2b8[0x1bd] = '\0';
    local_2b8[0x1be] = '\0';
    local_2b8[0x1bf] = '\0';
    local_2b8[0x1a0] = '\0';
    local_2b8[0x1a1] = '\0';
    local_2b8[0x1a2] = '\0';
    local_2b8[0x1a3] = '\0';
    local_2b8[0x1a4] = '\0';
    local_2b8[0x1a5] = '\0';
    local_2b8[0x1a6] = '\0';
    local_2b8[0x1a7] = '\0';
    local_2b8[0x1a8] = '\0';
    local_2b8[0x1a9] = '\0';
    local_2b8[0x1aa] = '\0';
    local_2b8[0x1ab] = '\0';
    local_2b8[0x1ac] = '\0';
    local_2b8[0x1ad] = '\0';
    local_2b8[0x1ae] = '\0';
    local_2b8[0x1af] = '\0';
    local_2b8[400] = '\0';
    local_2b8[0x191] = '\0';
    local_2b8[0x192] = '\0';
    local_2b8[0x193] = '\0';
    local_2b8[0x194] = '\0';
    local_2b8[0x195] = '\0';
    local_2b8[0x196] = '\0';
    local_2b8[0x197] = '\0';
    local_2b8[0x198] = '\0';
    local_2b8[0x199] = '\0';
    local_2b8[0x19a] = '\0';
    local_2b8[0x19b] = '\0';
    local_2b8[0x19c] = '\0';
    local_2b8[0x19d] = '\0';
    local_2b8[0x19e] = '\0';
    local_2b8[0x19f] = '\0';
    local_2b8[0x180] = '\0';
    local_2b8[0x181] = '\0';
    local_2b8[0x182] = '\0';
    local_2b8[0x183] = '\0';
    local_2b8[0x184] = '\0';
    local_2b8[0x185] = '\0';
    local_2b8[0x186] = '\0';
    local_2b8[0x187] = '\0';
    local_2b8[0x188] = '\0';
    local_2b8[0x189] = '\0';
    local_2b8[0x18a] = '\0';
    local_2b8[0x18b] = '\0';
    local_2b8[0x18c] = '\0';
    local_2b8[0x18d] = '\0';
    local_2b8[0x18e] = '\0';
    local_2b8[399] = '\0';
    local_2b8[0x170] = '\0';
    local_2b8[0x171] = '\0';
    local_2b8[0x172] = '\0';
    local_2b8[0x173] = '\0';
    local_2b8[0x174] = '\0';
    local_2b8[0x175] = '\0';
    local_2b8[0x176] = '\0';
    local_2b8[0x177] = '\0';
    local_2b8[0x178] = '\0';
    local_2b8[0x179] = '\0';
    local_2b8[0x17a] = '\0';
    local_2b8[0x17b] = '\0';
    local_2b8[0x17c] = '\0';
    local_2b8[0x17d] = '\0';
    local_2b8[0x17e] = '\0';
    local_2b8[0x17f] = '\0';
    local_2b8[0x160] = '\0';
    local_2b8[0x161] = '\0';
    local_2b8[0x162] = '\0';
    local_2b8[0x163] = '\0';
    local_2b8[0x164] = '\0';
    local_2b8[0x165] = '\0';
    local_2b8[0x166] = '\0';
    local_2b8[0x167] = '\0';
    local_2b8[0x168] = '\0';
    local_2b8[0x169] = '\0';
    local_2b8[0x16a] = '\0';
    local_2b8[0x16b] = '\0';
    local_2b8[0x16c] = '\0';
    local_2b8[0x16d] = '\0';
    local_2b8[0x16e] = '\0';
    local_2b8[0x16f] = '\0';
    local_2b8[0x150] = '\0';
    local_2b8[0x151] = '\0';
    local_2b8[0x152] = '\0';
    local_2b8[0x153] = '\0';
    local_2b8[0x154] = '\0';
    local_2b8[0x155] = '\0';
    local_2b8[0x156] = '\0';
    local_2b8[0x157] = '\0';
    local_2b8[0x158] = '\0';
    local_2b8[0x159] = '\0';
    local_2b8[0x15a] = '\0';
    local_2b8[0x15b] = '\0';
    local_2b8[0x15c] = '\0';
    local_2b8[0x15d] = '\0';
    local_2b8[0x15e] = '\0';
    local_2b8[0x15f] = '\0';
    local_2b8[0x140] = '\0';
    local_2b8[0x141] = '\0';
    local_2b8[0x142] = '\0';
    local_2b8[0x143] = '\0';
    local_2b8[0x144] = '\0';
    local_2b8[0x145] = '\0';
    local_2b8[0x146] = '\0';
    local_2b8[0x147] = '\0';
    local_2b8[0x148] = '\0';
    local_2b8[0x149] = '\0';
    local_2b8[0x14a] = '\0';
    local_2b8[0x14b] = '\0';
    local_2b8[0x14c] = '\0';
    local_2b8[0x14d] = '\0';
    local_2b8[0x14e] = '\0';
    local_2b8[0x14f] = '\0';
    local_2b8[0x130] = '\0';
    local_2b8[0x131] = '\0';
    local_2b8[0x132] = '\0';
    local_2b8[0x133] = '\0';
    local_2b8[0x134] = '\0';
    local_2b8[0x135] = '\0';
    local_2b8[0x136] = '\0';
    local_2b8[0x137] = '\0';
    local_2b8[0x138] = '\0';
    local_2b8[0x139] = '\0';
    local_2b8[0x13a] = '\0';
    local_2b8[0x13b] = '\0';
    local_2b8[0x13c] = '\0';
    local_2b8[0x13d] = '\0';
    local_2b8[0x13e] = '\0';
    local_2b8[0x13f] = '\0';
    local_2b8[0x120] = '\0';
    local_2b8[0x121] = '\0';
    local_2b8[0x122] = '\0';
    local_2b8[0x123] = '\0';
    local_2b8[0x124] = '\0';
    local_2b8[0x125] = '\0';
    local_2b8[0x126] = '\0';
    local_2b8[0x127] = '\0';
    local_2b8[0x128] = '\0';
    local_2b8[0x129] = '\0';
    local_2b8[0x12a] = '\0';
    local_2b8[299] = '\0';
    local_2b8[300] = '\0';
    local_2b8[0x12d] = '\0';
    local_2b8[0x12e] = '\0';
    local_2b8[0x12f] = '\0';
    local_2b8[0x110] = '\0';
    local_2b8[0x111] = '\0';
    local_2b8[0x112] = '\0';
    local_2b8[0x113] = '\0';
    local_2b8[0x114] = '\0';
    local_2b8[0x115] = '\0';
    local_2b8[0x116] = '\0';
    local_2b8[0x117] = '\0';
    local_2b8[0x118] = '\0';
    local_2b8[0x119] = '\0';
    local_2b8[0x11a] = '\0';
    local_2b8[0x11b] = '\0';
    local_2b8[0x11c] = '\0';
    local_2b8[0x11d] = '\0';
    local_2b8[0x11e] = '\0';
    local_2b8[0x11f] = '\0';
    local_2b8[0x100] = '\0';
    local_2b8[0x101] = '\0';
    local_2b8[0x102] = '\0';
    local_2b8[0x103] = '\0';
    local_2b8[0x104] = '\0';
    local_2b8[0x105] = '\0';
    local_2b8[0x106] = '\0';
    local_2b8[0x107] = '\0';
    local_2b8[0x108] = '\0';
    local_2b8[0x109] = '\0';
    local_2b8[0x10a] = '\0';
    local_2b8[0x10b] = '\0';
    local_2b8[0x10c] = '\0';
    local_2b8[0x10d] = '\0';
    local_2b8[0x10e] = '\0';
    local_2b8[0x10f] = '\0';
    snprintf(local_2b8 + 0x100,0x100,"%04u_%08X_0000",(ulong)in_RDI->m_ProgramNumber,
             local_10 & 0xffffffff);
    local_2b8[0xf0] = '\0';
    local_2b8[0xf1] = '\0';
    local_2b8[0xf2] = '\0';
    local_2b8[0xf3] = '\0';
    local_2b8[0xf4] = '\0';
    local_2b8[0xf5] = '\0';
    local_2b8[0xf6] = '\0';
    local_2b8[0xf7] = '\0';
    local_2b8[0xf8] = '\0';
    local_2b8[0xf9] = '\0';
    local_2b8[0xfa] = '\0';
    local_2b8[0xfb] = '\0';
    local_2b8[0xfc] = '\0';
    local_2b8[0xfd] = '\0';
    local_2b8[0xfe] = '\0';
    local_2b8[0xff] = '\0';
    local_2b8[0xe0] = '\0';
    local_2b8[0xe1] = '\0';
    local_2b8[0xe2] = '\0';
    local_2b8[0xe3] = '\0';
    local_2b8[0xe4] = '\0';
    local_2b8[0xe5] = '\0';
    local_2b8[0xe6] = '\0';
    local_2b8[0xe7] = '\0';
    local_2b8[0xe8] = '\0';
    local_2b8[0xe9] = '\0';
    local_2b8[0xea] = '\0';
    local_2b8[0xeb] = '\0';
    local_2b8[0xec] = '\0';
    local_2b8[0xed] = '\0';
    local_2b8[0xee] = '\0';
    local_2b8[0xef] = '\0';
    local_2b8[0xd0] = '\0';
    local_2b8[0xd1] = '\0';
    local_2b8[0xd2] = '\0';
    local_2b8[0xd3] = '\0';
    local_2b8[0xd4] = '\0';
    local_2b8[0xd5] = '\0';
    local_2b8[0xd6] = '\0';
    local_2b8[0xd7] = '\0';
    local_2b8[0xd8] = '\0';
    local_2b8[0xd9] = '\0';
    local_2b8[0xda] = '\0';
    local_2b8[0xdb] = '\0';
    local_2b8[0xdc] = '\0';
    local_2b8[0xdd] = '\0';
    local_2b8[0xde] = '\0';
    local_2b8[0xdf] = '\0';
    local_2b8[0xc0] = '\0';
    local_2b8[0xc1] = '\0';
    local_2b8[0xc2] = '\0';
    local_2b8[0xc3] = '\0';
    local_2b8[0xc4] = '\0';
    local_2b8[0xc5] = '\0';
    local_2b8[0xc6] = '\0';
    local_2b8[199] = '\0';
    local_2b8[200] = '\0';
    local_2b8[0xc9] = '\0';
    local_2b8[0xca] = '\0';
    local_2b8[0xcb] = '\0';
    local_2b8[0xcc] = '\0';
    local_2b8[0xcd] = '\0';
    local_2b8[0xce] = '\0';
    local_2b8[0xcf] = '\0';
    local_2b8[0xb0] = '\0';
    local_2b8[0xb1] = '\0';
    local_2b8[0xb2] = '\0';
    local_2b8[0xb3] = '\0';
    local_2b8[0xb4] = '\0';
    local_2b8[0xb5] = '\0';
    local_2b8[0xb6] = '\0';
    local_2b8[0xb7] = '\0';
    local_2b8[0xb8] = '\0';
    local_2b8[0xb9] = '\0';
    local_2b8[0xba] = '\0';
    local_2b8[0xbb] = '\0';
    local_2b8[0xbc] = '\0';
    local_2b8[0xbd] = '\0';
    local_2b8[0xbe] = '\0';
    local_2b8[0xbf] = '\0';
    local_2b8[0xa0] = '\0';
    local_2b8[0xa1] = '\0';
    local_2b8[0xa2] = '\0';
    local_2b8[0xa3] = '\0';
    local_2b8[0xa4] = '\0';
    local_2b8[0xa5] = '\0';
    local_2b8[0xa6] = '\0';
    local_2b8[0xa7] = '\0';
    local_2b8[0xa8] = '\0';
    local_2b8[0xa9] = '\0';
    local_2b8[0xaa] = '\0';
    local_2b8[0xab] = '\0';
    local_2b8[0xac] = '\0';
    local_2b8[0xad] = '\0';
    local_2b8[0xae] = '\0';
    local_2b8[0xaf] = '\0';
    local_2b8[0x90] = '\0';
    local_2b8[0x91] = '\0';
    local_2b8[0x92] = '\0';
    local_2b8[0x93] = '\0';
    local_2b8[0x94] = '\0';
    local_2b8[0x95] = '\0';
    local_2b8[0x96] = '\0';
    local_2b8[0x97] = '\0';
    local_2b8[0x98] = '\0';
    local_2b8[0x99] = '\0';
    local_2b8[0x9a] = '\0';
    local_2b8[0x9b] = '\0';
    local_2b8[0x9c] = '\0';
    local_2b8[0x9d] = '\0';
    local_2b8[0x9e] = '\0';
    local_2b8[0x9f] = '\0';
    local_2b8[0x80] = '\0';
    local_2b8[0x81] = '\0';
    local_2b8[0x82] = '\0';
    local_2b8[0x83] = '\0';
    local_2b8[0x84] = '\0';
    local_2b8[0x85] = '\0';
    local_2b8[0x86] = '\0';
    local_2b8[0x87] = '\0';
    local_2b8[0x88] = '\0';
    local_2b8[0x89] = '\0';
    local_2b8[0x8a] = '\0';
    local_2b8[0x8b] = '\0';
    local_2b8[0x8c] = '\0';
    local_2b8[0x8d] = '\0';
    local_2b8[0x8e] = '\0';
    local_2b8[0x8f] = '\0';
    local_2b8[0x70] = '\0';
    local_2b8[0x71] = '\0';
    local_2b8[0x72] = '\0';
    local_2b8[0x73] = '\0';
    local_2b8[0x74] = '\0';
    local_2b8[0x75] = '\0';
    local_2b8[0x76] = '\0';
    local_2b8[0x77] = '\0';
    local_2b8[0x78] = '\0';
    local_2b8[0x79] = '\0';
    local_2b8[0x7a] = '\0';
    local_2b8[0x7b] = '\0';
    local_2b8[0x7c] = '\0';
    local_2b8[0x7d] = '\0';
    local_2b8[0x7e] = '\0';
    local_2b8[0x7f] = '\0';
    local_2b8[0x60] = '\0';
    local_2b8[0x61] = '\0';
    local_2b8[0x62] = '\0';
    local_2b8[99] = '\0';
    local_2b8[100] = '\0';
    local_2b8[0x65] = '\0';
    local_2b8[0x66] = '\0';
    local_2b8[0x67] = '\0';
    local_2b8[0x68] = '\0';
    local_2b8[0x69] = '\0';
    local_2b8[0x6a] = '\0';
    local_2b8[0x6b] = '\0';
    local_2b8[0x6c] = '\0';
    local_2b8[0x6d] = '\0';
    local_2b8[0x6e] = '\0';
    local_2b8[0x6f] = '\0';
    local_2b8[0x50] = '\0';
    local_2b8[0x51] = '\0';
    local_2b8[0x52] = '\0';
    local_2b8[0x53] = '\0';
    local_2b8[0x54] = '\0';
    local_2b8[0x55] = '\0';
    local_2b8[0x56] = '\0';
    local_2b8[0x57] = '\0';
    local_2b8[0x58] = '\0';
    local_2b8[0x59] = '\0';
    local_2b8[0x5a] = '\0';
    local_2b8[0x5b] = '\0';
    local_2b8[0x5c] = '\0';
    local_2b8[0x5d] = '\0';
    local_2b8[0x5e] = '\0';
    local_2b8[0x5f] = '\0';
    local_2b8[0x40] = '\0';
    local_2b8[0x41] = '\0';
    local_2b8[0x42] = '\0';
    local_2b8[0x43] = '\0';
    local_2b8[0x44] = '\0';
    local_2b8[0x45] = '\0';
    local_2b8[0x46] = '\0';
    local_2b8[0x47] = '\0';
    local_2b8[0x48] = '\0';
    local_2b8[0x49] = '\0';
    local_2b8[0x4a] = '\0';
    local_2b8[0x4b] = '\0';
    local_2b8[0x4c] = '\0';
    local_2b8[0x4d] = '\0';
    local_2b8[0x4e] = '\0';
    local_2b8[0x4f] = '\0';
    local_2b8[0x30] = '\0';
    local_2b8[0x31] = '\0';
    local_2b8[0x32] = '\0';
    local_2b8[0x33] = '\0';
    local_2b8[0x34] = '\0';
    local_2b8[0x35] = '\0';
    local_2b8[0x36] = '\0';
    local_2b8[0x37] = '\0';
    local_2b8[0x38] = '\0';
    local_2b8[0x39] = '\0';
    local_2b8[0x3a] = '\0';
    local_2b8[0x3b] = '\0';
    local_2b8[0x3c] = '\0';
    local_2b8[0x3d] = '\0';
    local_2b8[0x3e] = '\0';
    local_2b8[0x3f] = '\0';
    local_2b8[0x20] = '\0';
    local_2b8[0x21] = '\0';
    local_2b8[0x22] = '\0';
    local_2b8[0x23] = '\0';
    local_2b8[0x24] = '\0';
    local_2b8[0x25] = '\0';
    local_2b8[0x26] = '\0';
    local_2b8[0x27] = '\0';
    local_2b8[0x28] = '\0';
    local_2b8[0x29] = '\0';
    local_2b8[0x2a] = '\0';
    local_2b8[0x2b] = '\0';
    local_2b8[0x2c] = '\0';
    local_2b8[0x2d] = '\0';
    local_2b8[0x2e] = '\0';
    local_2b8[0x2f] = '\0';
    local_2b8[0x10] = '\0';
    local_2b8[0x11] = '\0';
    local_2b8[0x12] = '\0';
    local_2b8[0x13] = '\0';
    local_2b8[0x14] = '\0';
    local_2b8[0x15] = '\0';
    local_2b8[0x16] = '\0';
    local_2b8[0x17] = '\0';
    local_2b8[0x18] = '\0';
    local_2b8[0x19] = '\0';
    local_2b8[0x1a] = '\0';
    local_2b8[0x1b] = '\0';
    local_2b8[0x1c] = '\0';
    local_2b8[0x1d] = '\0';
    local_2b8[0x1e] = '\0';
    local_2b8[0x1f] = '\0';
    local_2b8[0] = '\0';
    local_2b8[1] = '\0';
    local_2b8[2] = '\0';
    local_2b8[3] = '\0';
    local_2b8[4] = '\0';
    local_2b8[5] = '\0';
    local_2b8[6] = '\0';
    local_2b8[7] = '\0';
    local_2b8[8] = '\0';
    local_2b8[9] = '\0';
    local_2b8[10] = '\0';
    local_2b8[0xb] = '\0';
    local_2b8[0xc] = '\0';
    local_2b8[0xd] = '\0';
    local_2b8[0xe] = '\0';
    local_2b8[0xf] = '\0';
    snprintf(local_2b8,0x100,"%08X_0000",local_10 & 0xffffffff);
    std::__cxx11::string::string(local_2d8);
    std::__cxx11::string::operator=(local_2d8,local_88);
    std::__cxx11::string::operator+=(local_2d8,"/CLI_");
    std::__cxx11::string::operator+=(local_2d8,local_2b8 + 0x100);
    std::__cxx11::string::operator+=(local_2d8,".spv");
    this_00 = local_2f8;
    std::__cxx11::string::string(this_00);
    std::__cxx11::string::operator=(this_00,local_88);
    std::__cxx11::string::operator+=(local_2f8,"/CLI_");
    std::__cxx11::string::operator+=(local_2f8,local_2b8);
    std::__cxx11::string::operator+=(local_2f8,".spv");
    std::ifstream::ifstream(local_500);
    _Var4 = std::__cxx11::string::c_str();
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_500,_Var4);
    bVar3 = std::ios::good();
    uVar6 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff95c);
    if ((bVar3 & 1) == 0) {
      std::operator+((char *)CONCAT44(uVar6,in_stack_fffffffffffff958),in_stack_fffffffffffff950);
      dVar1 = (double)std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
      log(in_RDI,dVar1);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_580);
      std::ios::clear((long)local_500 + *(long *)(local_500[0] + -0x18),0);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_in,_S_bin);
      std::ifstream::open((char *)local_500,(_Ios_Openmode)__rhs);
      bVar3 = std::ios::good();
      if ((bVar3 & 1) == 0) {
        std::operator+((char *)CONCAT44(uVar6,_Var4),__rhs);
        dVar1 = (double)std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
        log(in_RDI,dVar1);
        std::__cxx11::string::~string(local_5e0);
        std::__cxx11::string::~string(local_600);
      }
      else {
        std::operator+((char *)CONCAT44(uVar6,_Var4),__rhs);
        dVar1 = (double)std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
        log(in_RDI,dVar1);
        std::__cxx11::string::~string(local_5a0);
        std::__cxx11::string::~string(local_5c0);
      }
    }
    else {
      std::operator+((char *)CONCAT44(uVar6,in_stack_fffffffffffff958),in_stack_fffffffffffff950);
      dVar1 = (double)std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
      log(in_RDI,dVar1);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_540);
    }
    bVar3 = std::ios::good();
    if ((bVar3 & 1) != 0) {
      local_608 = 0;
      std::istream::seekg((long)local_500,_S_beg);
      local_618 = std::istream::tellg();
      local_608 = std::fpos::operator_cast_to_long((fpos *)local_618);
      std::istream::seekg((long)local_500,_S_beg);
      local_620 = operator_new__(local_608);
      if (local_620 == (void *)0x0) {
        local_624 = 0;
        std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_624);
      }
      else {
        std::istream::read((char *)local_500,(long)local_620);
        pcVar5 = dispatch(in_RDI);
        local_30 = (*pcVar5->clCreateProgramWithIL)(local_18,local_620,local_608,local_20);
        if (local_30 != (cl_program)0x0) {
          logf(in_RDI,__x);
        }
        if (local_620 != (void *)0x0) {
          operator_delete__(local_620);
        }
      }
      std::ifstream::close();
    }
    std::ifstream::~ifstream(local_500);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_88);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x218fe9);
  return local_30;
}

Assistant:

cl_program CLIntercept::createProgramWithInjectionSPIRV(
    uint64_t hash,
    cl_context context,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    // Don't bother with any of this if we weren't able to get a pointer to
    // the entry point to create a program with IL.
    if( dispatch().clCreateProgramWithIL == NULL )
    {
        log( "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n" );
    }
    else
    {
        std::string fileName;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryNameWithoutPid(sc_DumpDirectoryName, fileName);
            fileName += "/Inject";
        }

        // Make three candidate file names.  They will have the form:
        //   CLI_<program number>_<hash>_0000.spv, or
        //   CLI_<hash>_0000.spv
        {
            char    numberString1[256] = "";
            CLI_SPRINTF(numberString1, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash);

            char    numberString2[256] = "";
            CLI_SPRINTF(numberString2, 256, "%08X_0000",
                (unsigned int)hash);

            std::string fileName1;
            fileName1 = fileName;
            fileName1 += "/CLI_";
            fileName1 += numberString1;
            fileName1 += ".spv";

            std::string fileName2;
            fileName2 = fileName;
            fileName2 += "/CLI_";
            fileName2 += numberString2;
            fileName2 += ".spv";

            std::ifstream is;

            is.open(
                fileName1.c_str(),
                std::ios::in | std::ios::binary);
            if( is.good() )
            {
                log("Injecting SPIR-V file: " + fileName1 + "\n");
            }
            else
            {
                log("Injection SPIR-V file doesn't exist: " + fileName1 + "\n");

                is.clear();
                is.open(
                    fileName2.c_str(),
                    std::ios::in | std::ios::binary);
                if( is.good() )
                {
                    log("Injecting SPIR-V file: " + fileName2 + "\n");
                }
                else
                {
                    log("Injection SPIR-V file doesn't exist: " + fileName2 + "\n");
                }
            }

            if( is.good() )
            {
                // The file exists.  Figure out how big it is.
                size_t  filesize = 0;

                is.seekg( 0, std::ios::end );
                filesize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                char*   newILBinary = new char[ filesize ];
                if( newILBinary == NULL )
                {
                    CLI_ASSERT( 0 );
                }
                else
                {
                    is.read(newILBinary, filesize);

                    // Right now, this can still die in the ICD loader if the ICD loader
                    // exports this entry point but the vendor didn't implement it.  It
                    // would be nice to enhance the ICD loader so it called into a safe
                    // stub function if the vendor didn't implement an entry point...
                    program = dispatch().clCreateProgramWithIL(
                        context,
                        newILBinary,
                        filesize,
                        errcode_ret );
                    if( program )
                    {
                        logf("Injection successful: clCreateProgramWithIL() returned %p\n",
                            program );
                    }

                    delete[] newILBinary;
                }

                is.close();
            }
        }
    }

    return program;
}